

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool substituteImports(value *v)

{
  size_type *psVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  *this;
  int iVar2;
  string *this_00;
  long lVar3;
  pointer pcVar4;
  pointer pbVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  bool bVar8;
  iterator __position;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  runtime_error *this_01;
  _Rb_tree_node_base *p_Var11;
  pointer pbVar12;
  bool bVar13;
  undefined1 local_2c0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  impit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string importFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *local_48;
  undefined1 local_40 [8];
  value importValue;
  
  if (v->type_ != 5) {
    return true;
  }
  this_00 = (v->u_).string_;
  local_2c0 = (undefined1  [8])&impit.first._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"import","");
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)this_00,(key_type *)local_2c0);
  if (local_2c0 != (undefined1  [8])&impit.first._M_string_length) {
    operator_delete((void *)local_2c0);
  }
  psVar1 = &this_00->_M_string_length;
  if (__position._M_node == (_Base_ptr)psVar1) {
    p_Var9 = *(_Rb_tree_node_base **)((long)&this_00->field_2 + 8);
    do {
      if (p_Var9 == (_Rb_tree_node_base *)psVar1) {
        return true;
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
              *)local_2c0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
              *)(p_Var9 + 1));
      bVar13 = substituteImports((value *)((long)&impit.first.field_2 + 8));
      uVar7 = impit.second._0_8_;
      if (impit.first.field_2._8_4_ == 5) {
        if (impit.second._0_8_ != 0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)impit.second._0_8_);
          goto LAB_00114886;
        }
      }
      else if (impit.first.field_2._8_4_ == 4) {
        if (impit.second._0_8_ != 0) {
          std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)impit.second._0_8_
                    );
          goto LAB_00114886;
        }
      }
      else if ((impit.first.field_2._8_4_ == 3) && (impit.second._0_8_ != 0)) {
        if (*(void **)impit.second._0_8_ != (void *)(impit.second._0_8_ + 0x10)) {
          operator_delete(*(void **)impit.second._0_8_);
        }
LAB_00114886:
        operator_delete((void *)uVar7);
      }
      if (local_2c0 != (undefined1  [8])&impit.first._M_string_length) {
        operator_delete((void *)local_2c0);
      }
      if (!bVar13) {
        if (p_Var9 == (_Rb_tree_node_base *)psVar1) {
          return true;
        }
        return false;
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while( true );
  }
  if (__position._M_node[2]._M_color != 3) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"\"type mismatch! call is<type>() before get<type>()\" && is<std::string>()")
    ;
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90 = (undefined1  [8])&importFile._M_string_length;
  lVar3 = *(long *)__position._M_node[2]._M_parent;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,lVar3,
             (long)&(__position._M_node[2]._M_parent)->_M_parent->_M_color + lVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  *)this_00,(const_iterator)__position._M_node);
  pbVar5 = options.includeDirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40._0_4_ = 0;
  bVar13 = options.includeDirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           options.includeDirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar13) {
    bVar13 = true;
    pbVar12 = options.includeDirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      importFile.field_2._8_8_ = &i._M_string_length;
      pcVar4 = (pbVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&importFile.field_2 + 8),pcVar4,pcVar4 + pbVar12->_M_string_length
                );
      local_2c0 = (undefined1  [8])((ulong)local_2c0 & 0xffffffff00000000);
      picojson::value::operator=((value *)local_40,(value *)local_2c0);
      _Var6 = impit.first._M_dataplus;
      if (local_2c0._0_4_ == 5) {
        if (impit.first._M_dataplus._M_p != (pointer)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)impit.first._M_dataplus._M_p);
          goto LAB_001145dd;
        }
      }
      else if (local_2c0._0_4_ == 4) {
        if (impit.first._M_dataplus._M_p != (pointer)0x0) {
          std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                     impit.first._M_dataplus._M_p);
          goto LAB_001145dd;
        }
      }
      else if ((local_2c0._0_4_ == 3) && (impit.first._M_dataplus._M_p != (pointer)0x0)) {
        if (*impit.first._M_dataplus._M_p != impit.first._M_dataplus._M_p + 0x10) {
          operator_delete(*impit.first._M_dataplus._M_p);
        }
LAB_001145dd:
        operator_delete(_Var6._M_p);
      }
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&importFile.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::ifstream::ifstream((value *)local_2c0,local_b0._M_dataplus._M_p,_S_in);
      iVar2 = *(int *)((long)&impit.first.field_2 + *(long *)((long)local_2c0 + -0x18) + 8);
      std::ifstream::close();
      std::ifstream::~ifstream((value *)local_2c0);
      if ((iVar2 == 0) && (bVar8 = loadFile(&local_b0,(value *)local_40), bVar8)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((size_type *)importFile.field_2._8_8_ != &i._M_string_length) {
          operator_delete((void *)importFile.field_2._8_8_);
        }
        break;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((size_type *)importFile.field_2._8_8_ != &i._M_string_length) {
        operator_delete((void *)importFile.field_2._8_8_);
      }
      pbVar12 = pbVar12 + 1;
      bVar13 = pbVar12 != pbVar5;
    } while (bVar13);
  }
  if (bVar13) {
    if (local_40._0_4_ == 5) {
      p_Var9 = *(_Rb_tree_node_base **)(importValue._0_8_ + 0x18);
      p_Var11 = (_Rb_tree_node_base *)(importValue._0_8_ + 8);
      if (p_Var9 != p_Var11) {
        this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)((long)&importFile.field_2 + 8);
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                  *)local_2c0,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                  *)(p_Var9 + 1));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
          ::pair<picojson::value_&,_true>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2c0,(value *)((long)&impit.first.field_2 + 8));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,picojson::value>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
                      *)this_00,this);
          if (i.field_2._8_4_ == 5) {
            if (local_48 !=
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)0x0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree(local_48);
              goto LAB_0011473f;
            }
          }
          else if (i.field_2._8_4_ == 4) {
            if (local_48 !=
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)0x0) {
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)local_48);
              goto LAB_0011473f;
            }
          }
          else if ((i.field_2._8_4_ == 3) &&
                  (local_48 !=
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                    *)0x0)) {
            if ((_Base_ptr *)*(undefined1 **)&local_48->_M_impl !=
                &(local_48->_M_impl).super__Rb_tree_header._M_header._M_parent) {
              operator_delete(*(undefined1 **)&local_48->_M_impl);
            }
LAB_0011473f:
            operator_delete(local_48);
          }
          if ((size_type *)importFile.field_2._8_8_ != &i._M_string_length) {
            operator_delete((void *)importFile.field_2._8_8_);
          }
          uVar7 = impit.second._0_8_;
          if (impit.first.field_2._8_4_ == 5) {
            if (impit.second._0_8_ != 0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)impit.second._0_8_);
              goto LAB_001147b7;
            }
          }
          else if (impit.first.field_2._8_4_ == 4) {
            if (impit.second._0_8_ != 0) {
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                         impit.second._0_8_);
              goto LAB_001147b7;
            }
          }
          else if ((impit.first.field_2._8_4_ == 3) && (impit.second._0_8_ != 0)) {
            if (*(void **)impit.second._0_8_ != (void *)(impit.second._0_8_ + 0x10)) {
              operator_delete(*(void **)impit.second._0_8_);
            }
LAB_001147b7:
            operator_delete((void *)uVar7);
          }
          if (local_2c0 != (undefined1  [8])&impit.first._M_string_length) {
            operator_delete((void *)local_2c0);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != p_Var11);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: failed \'import\' substitution of \'",0x28);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_90,(long)importFile._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if (local_40._0_4_ == 5) {
    if (importValue._0_8_ == 0) goto LAB_00114989;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)importValue._0_8_);
  }
  else if (local_40._0_4_ == 4) {
    if (importValue._0_8_ == 0) goto LAB_00114989;
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)importValue._0_8_);
  }
  else {
    if ((local_40._0_4_ != 3) || (importValue._0_8_ == 0)) goto LAB_00114989;
    if (*(void **)importValue._0_8_ != (void *)(importValue._0_8_ + 0x10)) {
      operator_delete(*(void **)importValue._0_8_);
    }
  }
  operator_delete((void *)importValue._0_8_);
LAB_00114989:
  if (local_90 != (undefined1  [8])&importFile._M_string_length) {
    operator_delete((void *)local_90);
  }
  if (bVar13) {
    return true;
  }
  return false;
}

Assistant:

static bool substituteImports(value *v)
{
    if (v->is<object>()) {
        object &o = v->get<object>();

        auto it = o.find("import");
        if (it != o.end()) {
            std::string importFile = it->second.get<std::string>();
            o.erase(it);

            value importValue;
            if (!loadFileInIncludeDirs(importFile, &importValue)) {
                cerr << "error: failed 'import' substitution of '" << importFile << "'" << endl;
                return false;
            }
            if (importValue.is<object>()) {
                for (auto impit : importValue.get<object>())
                    o.insert(pair<string,value>(impit.first, impit.second));
            }
        } else {
            for (auto i : o) {
                bool ok = substituteImports(&i.second);
                if (!ok)
                    return false;
            }
        }
    }
    return true;
}